

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRFormatInformation.cpp
# Opt level: O0

FormatInformation
ZXing::QRCode::FormatInformation::DecodeRMQR(uint32_t formatInfoBits1,uint32_t formatInfoBits2)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  FormatInformation FVar1;
  ErrorCorrectionLevel EVar2;
  int in_ESI;
  undefined4 in_EDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000e0;
  FormatInformation fi;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff00;
  iterator in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d5;
  FormatInformation local_a8;
  allocator_type local_95;
  int local_94;
  int *local_90;
  undefined8 local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_55;
  FormatInformation local_28;
  int local_18;
  undefined4 local_14;
  FormatInformation local_10;
  
  local_18 = in_ESI;
  local_14 = in_EDI;
  FormatInformation(&local_10);
  if (local_18 == 0) {
    local_d5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = local_14;
    local_d5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._5_8_ =
         (long)&local_d5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    local_d5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._13_8_ = 1;
    pvVar3 = &local_d5;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2fbf0a);
    __l_01._M_len = in_stack_ffffffffffffff10;
    __l_01._M_array = in_stack_ffffffffffffff08;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_ffffffffffffff00,__l_01,in_stack_fffffffffffffef8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2fbf44);
    local_a8 = FindBestFormatInfoRMQR(in_stack_000000e0,in_stack_000000d8);
    local_10.mask = local_a8.mask;
    local_10.data = local_a8.data;
    local_10._5_2_ = local_a8._5_2_;
    local_10.isMirrored = local_a8.isMirrored;
    local_10.dataMask = local_a8.dataMask;
    local_10.microVersion = local_a8.microVersion;
    local_10._10_2_ = local_a8._10_2_;
    local_10.ecLevel = local_a8.ecLevel;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar3);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2fbfb6);
  }
  else {
    local_55.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = local_14;
    local_55.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._5_8_ =
         (long)&local_55.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    local_55.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._13_8_ = 1;
    pvVar3 = &local_55;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2fbd4c);
    __l._M_len = in_stack_ffffffffffffff10;
    __l._M_array = in_stack_ffffffffffffff08;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (pvVar3,__l,in_stack_fffffffffffffef8);
    local_94 = local_18;
    local_90 = &local_94;
    local_88 = 1;
    __a = &local_95;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2fbdac);
    __l_00._M_len = in_stack_ffffffffffffff10;
    __l_00._M_array = in_stack_ffffffffffffff08;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar3,__l_00,__a);
    local_28 = FindBestFormatInfoRMQR(in_stack_000000e0,in_stack_000000d8);
    local_10.mask = local_28.mask;
    local_10.data = local_28.data;
    local_10._5_2_ = local_28._5_2_;
    local_10.isMirrored = local_28.isMirrored;
    local_10.dataMask = local_28.dataMask;
    local_10.microVersion = local_28.microVersion;
    local_10._10_2_ = local_28._10_2_;
    local_10.ecLevel = local_28.ecLevel;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffee0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2fbe45);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffee0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2fbe5f);
  }
  EVar2 = ECLevelFromBits((CONCAT21(local_10._5_2_,local_10.data) & 0x20) >> 4,false);
  FVar1.data = local_10.data;
  FVar1.mask = local_10.mask;
  FVar1.hammingDistance = local_10.hammingDistance;
  FVar1.bitsIndex = local_10.bitsIndex;
  FVar1.isMirrored = false;
  FVar1.dataMask = 4;
  FVar1.microVersion = (local_10.data & 0x1f) + 1;
  FVar1._10_2_ = local_10._10_2_;
  FVar1.ecLevel = EVar2;
  return FVar1;
}

Assistant:

FormatInformation FormatInformation::DecodeRMQR(uint32_t formatInfoBits1, uint32_t formatInfoBits2)
{
	FormatInformation fi;
	if (formatInfoBits2)
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {formatInfoBits2});
	else // TODO probably remove if `sampleRMQR()` done properly
		fi = FindBestFormatInfoRMQR({formatInfoBits1}, {});

	// Bit 6 is error correction (M/H), and bits 0-5 version.
	fi.ecLevel = ECLevelFromBits(((fi.data >> 5) & 1) << 1); // Shift to match QRCode M/H
	fi.dataMask = 4; // ((y / 2) + (x / 3)) % 2 == 0
	fi.microVersion = (fi.data & 0x1F) + 1;
	fi.isMirrored = false; // TODO: implement mirrored format bit reading

	return fi;
}